

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BlockStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BlockStatementSyntax,slang::syntax::BlockStatementSyntax_const&>
          (BumpAllocator *this,BlockStatementSyntax *args)

{
  BlockStatementSyntax *pBVar1;
  BlockStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pBVar1 = (BlockStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::BlockStatementSyntax::BlockStatementSyntax(in_RSI,pBVar1);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }